

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EthUdpPort.cpp
# Opt level: O1

int __thiscall EthUdpPort::PacketReceive(EthUdpPort *this,uchar *packet,size_t nbytes)

{
  ostream *poVar1;
  int iVar2;
  
  iVar2 = SocketInternals::Recv
                    (this->sockPtr,packet,nbytes,(this->super_EthBasePort).ReceiveTimeout);
  if (iVar2 == 8) {
    poVar1 = (this->super_EthBasePort).super_BasePort.outStr;
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"PacketReceive: only extra data",0x1e)
    ;
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
    std::ostream::put((char)poVar1);
    std::ostream::flush();
    EthBasePort::ProcessExtraData(&this->super_EthBasePort,packet);
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

int EthUdpPort::PacketReceive(unsigned char *packet, size_t nbytes)
{
    int nRecv = sockPtr->Recv(packet, nbytes, ReceiveTimeout);
    if (nRecv == static_cast<int>(FW_EXTRA_SIZE)) {
        outStr << "PacketReceive: only extra data" << std::endl;
        ProcessExtraData(packet);
        nRecv = 0;
    }
    return nRecv;
}